

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directize.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_222::FunctionDirectizer::doWalkFunction(FunctionDirectizer *this,Function *func)

{
  ReFinalize local_158;
  
  Walker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>
  ::walk(&(this->
          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
          ).
          super_PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>
         ,&func->body);
  if (this->changedTypes == true) {
    ReFinalize::ReFinalize(&local_158);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_158.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .
                super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
               func,(this->
                    super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
                    ).
                    super_PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>
                    .
                    super_Walker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>
                    .currModule);
    ReFinalize::~ReFinalize(&local_158);
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    WalkerPass<PostWalker<FunctionDirectizer>>::doWalkFunction(func);
    if (changedTypes) {
      ReFinalize().walkFunctionInModule(func, getModule());
    }
  }